

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomThreeAction::Use(GreenRoomThreeAction *this)

{
  ItemTable *pIVar1;
  itemLocation iVar2;
  itemLocation iVar3;
  itemType iVar4;
  ItemWrapper *pIVar5;
  ActionResults *pAVar6;
  bool bVar7;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  itemType local_68 [2];
  undefined1 local_5d;
  allocator local_49;
  string local_48 [36];
  itemType local_24 [3];
  GreenRoomThreeAction *local_18;
  GreenRoomThreeAction *this_local;
  
  pIVar1 = (this->super_AbstractRoomAction).itemList;
  local_18 = this;
  local_24[2] = Command::getMainItem((this->super_AbstractRoomAction).commands);
  pIVar5 = ItemTable::getValue(pIVar1,local_24 + 2);
  iVar2 = ItemWrapper::getLocation(pIVar5);
  bVar7 = true;
  if (iVar2 != BACKPACK) {
    local_24[1] = 0;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_24 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar5);
    pIVar1 = (this->super_AbstractRoomAction).itemList;
    local_24[0] = Command::getMainItem((this->super_AbstractRoomAction).commands);
    pIVar5 = ItemTable::getValue(pIVar1,local_24);
    iVar3 = ItemWrapper::getLocation(pIVar5);
    bVar7 = iVar2 == iVar3;
  }
  if (bVar7) {
    iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (((iVar4 != BUCKET) ||
        (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands), iVar4 != BASIN)
        ) && ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands),
              iVar4 != BASIN ||
              (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
              iVar4 != BUCKET)))) {
      iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (((iVar4 == BASIN) ||
          (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
          iVar4 == BASIN)) &&
         ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands),
          iVar4 == CLEAN_BUCKET ||
          (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
          iVar4 == CLEAN_BUCKET)))) {
        pAVar6 = (ActionResults *)operator_new(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b0,"You pour out and re-fill the bucket with ice-cold water",&local_b1);
        ActionResults::ActionResults(pAVar6,CURRENT,(string *)local_b0);
        this_local = (GreenRoomThreeAction *)pAVar6;
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
      else {
        this_local = (GreenRoomThreeAction *)
                     AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      }
      return (ActionResults *)this_local;
    }
    local_68[1] = 0x12;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_68 + 1);
    ItemWrapper::setLocation(pIVar5,INACTIVE);
    local_68[0] = CLEAN_BUCKET;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_68);
    ItemWrapper::setLocation(pIVar5,ACTIVE);
    pAVar6 = (ActionResults *)operator_new(0x30);
    local_8a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,
               "You cleaned the bloody bucket! You now have a clean bucket filled with water!",
               &local_89);
    ActionResults::ActionResults(pAVar6,CURRENT,(string *)local_88);
    local_8a = 0;
    this_local = (GreenRoomThreeAction *)pAVar6;
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    return (ActionResults *)this_local;
  }
  pAVar6 = (ActionResults *)operator_new(0x30);
  local_5d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"No item to use here",&local_49);
  ActionResults::ActionResults(pAVar6,CURRENT,(string *)local_48);
  local_5d = 0;
  this_local = (GreenRoomThreeAction *)pAVar6;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *GreenRoomThreeAction::Use() {

    if(!(itemList->getValue(commands->getMainItem())->getLocation() == BACKPACK || itemList->getValue(PLAYER)->getLocation() == itemList->getValue(commands->getMainItem())->getLocation()))
    {
        return new ActionResults(CURRENT, "No item to use here");
    }

    if((commands->getMainItem() == BUCKET && commands->getActedOnItem() == BASIN) ||
            (commands->getMainItem() == BASIN && commands->getActedOnItem() == BUCKET)) {

        itemList->getValue(BLOOD_BUCKET)->setLocation(INACTIVE);
        itemList->getValue(CLEAN_BUCKET)->setLocation(ACTIVE);
        return new ActionResults(CURRENT, "You cleaned the bloody bucket! You now have a clean bucket filled with water!");
    }
    else if ((commands->getMainItem() == BASIN || commands->getActedOnItem() == BASIN) &&
                                                         (commands->getMainItem() == CLEAN_BUCKET || commands->getActedOnItem() == CLEAN_BUCKET))
    {
        return new ActionResults(CURRENT,"You pour out and re-fill the bucket with ice-cold water");
    } else {
        return AbstractRoomAction::Use();
    }
}